

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calculator.cpp
# Opt level: O0

void __thiscall Calculator::parse(Calculator *this,String *e)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  EnumWrapper<const_asl::Array<Calculator::Token>_> *pEVar6;
  Token *pTVar7;
  Array<Calculator::Token> *extraout_RDX;
  Array<Calculator::Token> *e_00;
  Array<Calculator::Token> *extraout_RDX_00;
  Array<Calculator::Token> *extraout_RDX_01;
  Array<Calculator::Token> *extraout_RDX_02;
  Array<Calculator::Token> *extraout_RDX_03;
  Array<Calculator::Token> *extraout_RDX_04;
  Array<Calculator::Token> *extraout_RDX_05;
  Array<Calculator::Token> *extraout_RDX_06;
  Array<Calculator::Token> *extraout_RDX_07;
  Array<Calculator::Token> *extraout_RDX_08;
  double v;
  Token local_220;
  undefined4 local_1f4;
  Token local_1f0;
  Token local_1c8;
  Token local_1a0;
  Token local_178;
  char local_14d;
  int local_14c;
  char op;
  Token *pTStack_148;
  int i;
  Token *token;
  EnumWrapper_ *local_128;
  EnumWrapper_ *_b_;
  Token local_f8;
  String local_d0;
  Token local_b8;
  Token local_90;
  char local_65;
  int local_64;
  undefined1 local_60 [3];
  char c;
  TokenType type;
  String name;
  char *local_38;
  char *p;
  String e1;
  String *e_local;
  Calculator *this_local;
  
  e1.field_2._8_8_ = e;
  asl::Array<Calculator::Token>::clear(&this->_input);
  asl::Array<Calculator::Token>::clear(&this->_output);
  asl::String::operator+((String *)&p,(String *)e1.field_2._8_8_,' ');
  pcVar5 = asl::String::operator_cast_to_char_((String *)&p);
  asl::String::String((String *)local_60);
  local_64 = 0;
  e_00 = extraout_RDX;
  while( true ) {
    local_38 = pcVar5;
    pcVar5 = local_38 + 1;
    local_65 = *local_38;
    if (local_65 == '\0') break;
    if (local_64 == 0) {
      iVar3 = (int)local_65;
      if (iVar3 - 0x28U < 2) {
        asl::String::String(&local_d0,local_65);
        Token::Token(&local_b8,SEP,&local_d0);
        asl::Array<Calculator::Token>::operator<<(&this->_input,&local_b8);
        Token::~Token(&local_b8);
        asl::String::~String(&local_d0);
        e_00 = extraout_RDX_01;
      }
      else if ((((iVar3 - 0x2aU < 2) || (iVar3 == 0x2d)) || (iVar3 == 0x2f)) || (iVar3 == 0x5e)) {
        Token::Token(&local_90,local_65);
        asl::Array<Calculator::Token>::operator<<(&this->_input,&local_90);
        Token::~Token(&local_90);
        e_00 = extraout_RDX_00;
      }
      else if (((local_65 < '0') || ('9' < local_65)) && ((local_65 != '.' && (local_65 != '-')))) {
        iVar3 = isalpha((int)local_65);
        e_00 = extraout_RDX_03;
        if (iVar3 != 0) {
          local_64 = 3;
          asl::String::operator=((String *)local_60,&local_65);
          e_00 = extraout_RDX_04;
        }
      }
      else {
        local_64 = 4;
        asl::String::operator=((String *)local_60,&local_65);
        e_00 = extraout_RDX_02;
      }
    }
    else if (local_64 == 3) {
      iVar3 = isalnum((int)local_65);
      if (iVar3 == 0) {
        Token::Token((Token *)&_b_,NAME,(String *)local_60);
        asl::Array<Calculator::Token>::operator<<(&this->_input,(Token *)&_b_);
        Token::~Token((Token *)&_b_);
        local_64 = 0;
        e_00 = extraout_RDX_08;
        pcVar5 = local_38;
      }
      else {
        asl::String::operator<<((String *)local_60,local_65);
        e_00 = extraout_RDX_07;
      }
    }
    else if (local_64 == 4) {
      if (((local_65 < '0') || ('9' < local_65)) &&
         (((local_65 != '.' && (local_65 != 'e')) && ((local_65 != '-' || (local_38[-1] != 'e'))))))
      {
        v = asl::String::operator_cast_to_double((String *)local_60);
        Token::Token(&local_f8,v);
        asl::Array<Calculator::Token>::operator<<(&this->_input,&local_f8);
        Token::~Token(&local_f8);
        local_64 = 0;
        e_00 = extraout_RDX_05;
        pcVar5 = local_38;
      }
      else {
        asl::String::operator<<((String *)local_60,local_65);
        e_00 = extraout_RDX_06;
      }
    }
  }
  asl::newEnumerator<asl::Array<Calculator::Token>>
            ((EnumWrapper<asl::Array<Calculator::Token>_> *)&token,(asl *)this,e_00);
  local_128 = (EnumWrapper_ *)&token;
  while( true ) {
    pEVar6 = asl::enumData<asl::Array<Calculator::Token>const>
                       ((Array<Calculator::Token> *)0x0,local_128);
    bVar1 = asl::EnumWrapper::operator_cast_to_bool((EnumWrapper *)pEVar6);
    bVar2 = false;
    if (bVar1) {
      bVar2 = local_128->more != 0;
    }
    if (!bVar2) break;
    pEVar6 = asl::enumData<asl::Array<Calculator::Token>const>
                       ((Array<Calculator::Token> *)0x0,local_128);
    pTStack_148 = asl::Array<Calculator::Token>::Enumerator::operator*((Enumerator *)(pEVar6 + 8));
    while (0 < local_128->more) {
      pEVar6 = asl::enumData<asl::Array<Calculator::Token>const>
                         ((Array<Calculator::Token> *)0x0,local_128);
      local_14c = asl::Array<Calculator::Token>::Enumerator::operator~((Enumerator *)(pEVar6 + 8));
LAB_0010c6d7:
      if (local_128->more != 0) {
        switch(pTStack_148->type) {
        case OP:
          pcVar5 = asl::String::operator[](&pTStack_148->val,0);
          local_14d = *pcVar5;
          if (local_14d != '-') {
LAB_0010ca81:
            do {
              iVar3 = asl::Array<Calculator::Token>::length
                                (&(this->_operators).super_Array<Calculator::Token>);
              bVar2 = false;
              if (0 < iVar3) {
                pTVar7 = asl::Stack<Calculator::Token>::top(&this->_operators);
                bVar1 = asl::String::operator!=(&pTVar7->val,'(');
                bVar2 = false;
                if (bVar1) {
                  if (local_14d != '^') {
                    iVar3 = precedence(&pTStack_148->val);
                    pTVar7 = asl::Stack<Calculator::Token>::top(&this->_operators);
                    iVar4 = precedence(&pTVar7->val);
                    bVar2 = true;
                    if (iVar3 <= iVar4) goto LAB_0010cbfb;
                  }
                  bVar2 = false;
                  if (local_14d == '^') {
                    iVar3 = precedence(&pTStack_148->val);
                    pTVar7 = asl::Stack<Calculator::Token>::top(&this->_operators);
                    iVar4 = precedence(&pTVar7->val);
                    bVar2 = iVar3 < iVar4;
                  }
                }
              }
LAB_0010cbfb:
              if (!bVar2) goto LAB_0010cc71;
              asl::Stack<Calculator::Token>::popget(&local_1f0,&this->_operators);
              asl::Array<Calculator::Token>::operator<<(&this->_output,&local_1f0);
              Token::~Token(&local_1f0);
            } while( true );
          }
          if ((local_14c != 0) &&
             (pTVar7 = asl::Array<Calculator::Token>::operator[](&this->_input,local_14c + -1),
             pTVar7->type != OP)) {
            pTVar7 = asl::Array<Calculator::Token>::operator[](&this->_input,local_14c + -1);
            bVar2 = asl::String::operator==(&pTVar7->val,'(');
            if (!bVar2) goto LAB_0010ca81;
          }
          Token::Token(&local_1c8,'_');
          asl::Stack<Calculator::Token>::push(&this->_operators,&local_1c8);
          Token::~Token(&local_1c8);
          break;
        case SEP:
          pcVar5 = asl::String::operator[](&pTStack_148->val,0);
          local_14d = *pcVar5;
          if (local_14d == '(') {
            Token::Token(&local_178,'(');
            asl::Stack<Calculator::Token>::push(&this->_operators,&local_178);
            Token::~Token(&local_178);
          }
          else if (local_14d == ')') {
            while( true ) {
              pTVar7 = asl::Stack<Calculator::Token>::top(&this->_operators);
              bVar2 = asl::String::operator!=(&pTVar7->val,'(');
              if (!bVar2) break;
              asl::Stack<Calculator::Token>::popget(&local_1a0,&this->_operators);
              asl::Array<Calculator::Token>::operator<<(&this->_output,&local_1a0);
              Token::~Token(&local_1a0);
            }
            asl::Stack<Calculator::Token>::pop(&this->_operators);
          }
          break;
        case NAME:
          pTVar7 = asl::Array<Calculator::Token>::operator[](&this->_input,local_14c + 1);
          if (pTVar7->type == SEP) {
            pTVar7 = asl::Array<Calculator::Token>::operator[](&this->_input,local_14c + 1);
            bVar2 = asl::String::operator==(&pTVar7->val,'(');
            if (bVar2) {
              asl::Stack<Calculator::Token>::push(&this->_operators,pTStack_148);
              break;
            }
          }
          asl::Array<Calculator::Token>::operator<<(&this->_output,pTStack_148);
          break;
        case NUMBER:
          asl::Array<Calculator::Token>::operator<<(&this->_output,pTStack_148);
        }
        goto switchD_0010c71a_default;
      }
      local_128->more = local_128->more + -2;
    }
    pEVar6 = asl::enumData<asl::Array<Calculator::Token>const>
                       ((Array<Calculator::Token> *)0x0,local_128);
    asl::Array<Calculator::Token>::Enumerator::operator++((Enumerator *)(pEVar6 + 8));
    local_128->more = -1 - local_128->more;
  }
  do {
    iVar3 = asl::Array<Calculator::Token>::length
                      (&(this->_operators).super_Array<Calculator::Token>);
    if (iVar3 < 1) {
      local_1f4 = 0;
LAB_0010ce3d:
      asl::String::~String((String *)local_60);
      asl::String::~String((String *)&p);
      return;
    }
    pTVar7 = asl::Stack<Calculator::Token>::top(&this->_operators);
    bVar2 = asl::String::operator==(&pTVar7->val,'(');
    if (bVar2) {
LAB_0010cdae:
      printf("Mismatch\n");
      local_1f4 = 1;
      goto LAB_0010ce3d;
    }
    pTVar7 = asl::Stack<Calculator::Token>::top(&this->_operators);
    bVar2 = asl::String::operator==(&pTVar7->val,')');
    if (bVar2) goto LAB_0010cdae;
    asl::Stack<Calculator::Token>::popget(&local_220,&this->_operators);
    asl::Array<Calculator::Token>::operator<<(&this->_output,&local_220);
    Token::~Token(&local_220);
  } while( true );
LAB_0010cc71:
  asl::Stack<Calculator::Token>::push(&this->_operators,pTStack_148);
switchD_0010c71a_default:
  local_128->more = local_128->more + -1;
  goto LAB_0010c6d7;
}

Assistant:

void Calculator::parse(const String& e)
{
	_input.clear();
	_output.clear();
	String e1 = e + ' ';
	const char* p = e1;
	String name;
	TokenType type = NONE;
	while (char c = *p++)
	{
		switch (type) {
		case NONE:
			switch (c)
			{
			case '+': case '-': case '*': case '/': case '^':
				_input << c;
				break;
			case '(': case ')':
				_input << Token(SEP, String(c));
				break;
			default:
				if ((c >= '0' && c <= '9') || c == '.' || c == '-') {
					type = NUMBER;
					name = c;
				}
				else if (isalpha(c)) {
					type = NAME;
					name = c;
				}
				break;
			}
			break;
		case NUMBER:
			if (!((c >= '0' && c <= '9') || c == '.' || c == 'e' || (c=='-' && *(p-2)=='e'))) {
				_input << Token((double)name);
				type = NONE;
				p--;
				break;
			}
			else
				name << c;
			break;
		case NAME:
			if (isalnum(c))
				name << c;
			else
			{
				_input << Token(NAME, name);
				p--;
				type = NONE;
			}
			break;
		default:
			break;
		}
	}

	// build reverse

	foreach2(int i, const Token& token, _input)
	{
		char op;
		switch (token.type)
		{
		case NUMBER: _output << token;
			break;
		case NAME:
			if (_input[i + 1].type == SEP && _input[i + 1].val == '(')
				_operators.push(token);
			else
				_output << token;
			break;
		case SEP:
			op = token.val[0];
			switch (op)
			{
			case '(': _operators.push(op);
				break;
			case ')':
				while (_operators.top().val != '(')
					_output << _operators.popget();
				_operators.pop();
				break;
			}
			break;

		case OP:
			op = token.val[0];
			if (op == '-' && (i == 0 || _input[i - 1].type == OP || _input[i - 1].val == '('))
			{
				_operators.push('_');
				break;
			}
			while (_operators.length() > 0 && _operators.top().val != '(' && (
				(op != '^' && precedence(token.val) <= precedence(_operators.top().val)) ||
				(op == '^' && precedence(token.val) < precedence(_operators.top().val))))
				_output << _operators.popget();
			_operators.push(token);
		default:
			break;
		}
	}

	while (_operators.length() > 0)
	{
		if (_operators.top().val == '(' || _operators.top().val == ')') {
			printf("Mismatch\n");
			return;
		}
		else
			_output << _operators.popget();
	}
}